

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

uint strHash(char *z)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    bVar1 = *z;
    if ((ulong)bVar1 == 0) break;
    z = (char *)((byte *)z + 1);
    uVar2 = (uVar2 + ""[bVar1]) * -0x61c8864f;
  }
  return uVar2;
}

Assistant:

static unsigned int strHash(const char *z){
  unsigned int h = 0;
  unsigned char c;
  while( (c = (unsigned char)*z++)!=0 ){     /*OPTIMIZATION-IF-TRUE*/
    /* Knuth multiplicative hashing.  (Sorting & Searching, p. 510).
    ** 0x9e3779b1 is 2654435761 which is the closest prime number to
    ** (2**32)*golden_ratio, where golden_ratio = (sqrt(5) - 1)/2. */
    h += sqlite3UpperToLower[c];
    h *= 0x9e3779b1;
  }
  return h;
}